

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O3

void __thiscall
ut11::Mock<void(TestEvent<1>)>::VerifyTimes<int,ut11::Operands::IsAny<TestEvent<1>>>
          (Mock<void(TestEvent<1>)> *this,size_t param_2,long *param_3,int *param_4)

{
  const_iterator __end0;
  Mock<void(TestEvent<1>)> *pMVar1;
  size_t actual;
  string local_68;
  string local_48;
  
  actual = 0xffffffffffffffff;
  pMVar1 = this + 0x20;
  do {
    pMVar1 = *(Mock<void(TestEvent<1>)> **)pMVar1;
    actual = actual + 1;
  } while (pMVar1 != this + 0x20);
  if ((long)*param_4 != actual) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,*param_3,param_3[1] + *param_3);
    GetVerifyFailTimesMessageForCount_abi_cxx11_(&local_48,this,(long)*param_4,actual);
    Assert::Fail(param_2,&local_68,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void VerifyTimes(std::true_type isOperand, std::size_t line, std::string file, const Count& count, const Expectations&... expectations) const
		{
			auto actual = m_argumentHandler.CountCalls(expectations...);
			if ( actual != count )
				Assert::Fail(line, file, GetVerifyFailTimesMessageForCount(count, actual));
		}